

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20250127::container_internal::operator==(iterator *a,iterator *b)

{
  char *pcVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  FileDescriptor *pFVar4;
  pointer pLVar5;
  pointer pLVar6;
  FeatureSet *pFVar7;
  uint uVar8;
  char cVar9;
  slot_type *psVar10;
  slot_type *psVar11;
  undefined1 extraout_AL;
  ulong uVar12;
  bool bVar13;
  byte bVar14;
  uint uVar15;
  slot_type *psVar16;
  ulong extraout_RDX;
  ulong uVar17;
  iterator *piVar18;
  slot_type *psVar19;
  ushort uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  anon_class_16_2_3fe5d3b9 f;
  ulong uStack_80;
  slot_type *psStack_28;
  char cVar24;
  char cVar26;
  char cVar27;
  char cVar28;
  
  psVar19 = (slot_type *)a->ctrl_;
  if ((psVar19 == (slot_type *)(kEmptyGroup + 0x10) || psVar19 == (slot_type *)0x0) ||
     (kSentinel < *(ctrl_t *)psVar19)) {
    psVar2 = (slot_type *)b->ctrl_;
    if ((psVar2 != (slot_type *)(kEmptyGroup + 0x10) && psVar2 != (slot_type *)0x0) &&
       (*(ctrl_t *)psVar2 < ~kSentinel)) goto LAB_001e9d17;
    if (psVar19 == (slot_type *)(kEmptyGroup + 0x10) && psVar2 == (slot_type *)(kEmptyGroup + 0x10))
    {
LAB_001e9d0a:
      return psVar19 == psVar2;
    }
    if ((psVar19 == (slot_type *)(kEmptyGroup + 0x10)) !=
        (psVar2 == (slot_type *)(kEmptyGroup + 0x10))) goto LAB_001e9d1c;
    if (psVar19 == (slot_type *)0x0 || psVar2 == (slot_type *)0x0) goto LAB_001e9d0a;
    if ((psVar2 == (slot_type *)kSooControl) == (psVar19 == (slot_type *)kSooControl)) {
      a = (iterator *)(a->field_1).slot_;
      psVar3 = (b->field_1).slot_;
      if (psVar19 == (slot_type *)kSooControl) {
        bVar13 = (slot_type *)a == psVar3;
      }
      else {
        psVar16 = psVar3;
        psVar10 = psVar2;
        psVar11 = (slot_type *)a;
        if (psVar2 < psVar19) {
          psVar16 = (slot_type *)a;
          psVar10 = psVar19;
          psVar11 = psVar3;
        }
        b = (iterator *)CONCAT71((int7)((ulong)psVar10 >> 8),psVar10 < psVar11);
        bVar13 = psVar11 <= psVar16 && psVar10 < psVar11;
      }
      if (bVar13) goto LAB_001e9d0a;
    }
  }
  else {
    operator==();
LAB_001e9d17:
    operator==();
LAB_001e9d1c:
    operator==();
  }
  operator==();
  piVar18 = b;
  psVar19 = (slot_type *)a;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
              *)a);
  if (b == (iterator *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
    ::erase();
  }
  else if (b != (iterator *)(kEmptyGroup + 0x10)) {
    if (-1 < *(char *)&b->ctrl_) {
      f.slot = &psStack_28;
      f.this = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
                *)a;
      CommonFields::
      RunWithReentrancyGuard<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>::destroy(absl::lts_20250127::container_internal::map_slot_type<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>*)::_lambda()_1_>
                ((CommonFields *)a,f);
      EraseMetaOnly((CommonFields *)a,
                    (long)b - (long)(((value_type *)a)->second).
                                    super__Vector_base<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,0x20);
      return (bool)extraout_AL;
    }
    goto LAB_001e9d92;
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
  ::erase();
LAB_001e9d92:
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
  ::erase();
  pFVar4 = (psVar19->value).first;
  if (((ulong)&pFVar4->is_placeholder_ & (ulong)pFVar4) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  pLVar5 = (psVar19->value).second.
           super__Vector_base<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar17 = (extraout_RDX >> 7 ^ (ulong)pLVar5 >> 0xc) & (ulong)pFVar4;
  bVar14 = (byte)extraout_RDX;
  uVar12 = (ulong)(bVar14 & 0x7f);
  auVar22 = ZEXT216(CONCAT11(bVar14,bVar14) & 0x7f7f);
  auVar22 = pshuflw(auVar22,auVar22,0);
  uStack_80 = 0;
  do {
    pcVar1 = (char *)((long)&pLVar5->proto_features + uVar17);
    cVar9 = pcVar1[0xf];
    cVar24 = auVar22[0];
    auVar25[0] = -(cVar24 == *pcVar1);
    cVar26 = auVar22[1];
    auVar25[1] = -(cVar26 == pcVar1[1]);
    cVar27 = auVar22[2];
    auVar25[2] = -(cVar27 == pcVar1[2]);
    cVar28 = auVar22[3];
    auVar25[3] = -(cVar28 == pcVar1[3]);
    auVar25[4] = -(cVar24 == pcVar1[4]);
    auVar25[5] = -(cVar26 == pcVar1[5]);
    auVar25[6] = -(cVar27 == pcVar1[6]);
    auVar25[7] = -(cVar28 == pcVar1[7]);
    auVar25[8] = -(cVar24 == pcVar1[8]);
    auVar25[9] = -(cVar26 == pcVar1[9]);
    auVar25[10] = -(cVar27 == pcVar1[10]);
    auVar25[0xb] = -(cVar28 == pcVar1[0xb]);
    auVar25[0xc] = -(cVar24 == pcVar1[0xc]);
    auVar25[0xd] = -(cVar26 == pcVar1[0xd]);
    auVar25[0xe] = -(cVar27 == pcVar1[0xe]);
    auVar25[0xf] = -(cVar28 == cVar9);
    uVar20 = (ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe | (ushort)(auVar25[0xf] >> 7) << 0xf;
    uVar15 = (uint)uVar20;
    bVar13 = uVar20 == 0;
    if (!bVar13) {
      pLVar6 = (psVar19->value).second.
               super__Vector_base<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        uVar8 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        uVar21 = uVar8 + uVar17 & (ulong)pFVar4;
        pFVar7 = (&((psVar19->value).second.
                    super__Vector_base<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->proto_features)[uVar21 * 4]
        ;
        if (pFVar7 == (FeatureSet *)piVar18->ctrl_) {
          if (pLVar6 == (pointer)0x0) {
            __assert_fail("ctrl != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x9ef,
                          "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>]"
                         );
          }
          uVar12 = (long)&pLVar6->proto_features + uVar21;
        }
        if (pFVar7 == (FeatureSet *)piVar18->ctrl_) break;
        uVar20 = (ushort)(uVar15 - 1) & (ushort)uVar15;
        uVar15 = CONCAT22((short)(uVar15 - 1 >> 0x10),uVar20);
        bVar13 = uVar20 == 0;
      } while (!bVar13);
    }
    if (bVar13) {
      auVar23[0] = -(*pcVar1 == -0x80);
      auVar23[1] = -(pcVar1[1] == -0x80);
      auVar23[2] = -(pcVar1[2] == -0x80);
      auVar23[3] = -(pcVar1[3] == -0x80);
      auVar23[4] = -(pcVar1[4] == -0x80);
      auVar23[5] = -(pcVar1[5] == -0x80);
      auVar23[6] = -(pcVar1[6] == -0x80);
      auVar23[7] = -(pcVar1[7] == -0x80);
      auVar23[8] = -(pcVar1[8] == -0x80);
      auVar23[9] = -(pcVar1[9] == -0x80);
      auVar23[10] = -(pcVar1[10] == -0x80);
      auVar23[0xb] = -(pcVar1[0xb] == -0x80);
      auVar23[0xc] = -(pcVar1[0xc] == -0x80);
      auVar23[0xd] = -(pcVar1[0xd] == -0x80);
      auVar23[0xe] = -(pcVar1[0xe] == -0x80);
      auVar23[0xf] = -(cVar9 == -0x80);
      if ((((((((((((((((auVar23 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar23 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar23 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar23 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar23 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar23 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar23 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar23 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar23 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar23 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar23 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar23 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar9 == -0x80) {
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
                    *)&psVar19->value);
        uVar12 = 0;
        goto LAB_001e9e8a;
      }
      if ((psVar19->value).first < uStack_80 + 0x10) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe37,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>, K = const google::protobuf::FileDescriptor *]"
                     );
      }
      uVar17 = uStack_80 + 0x10 + uVar17 & (ulong)pFVar4;
      bVar13 = true;
      uStack_80 = uStack_80 + 0x10;
    }
    else {
LAB_001e9e8a:
      bVar13 = false;
    }
    if (!bVar13) {
      return SUB81(uVar12,0);
    }
  } while( true );
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }